

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<33>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<33> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  int in_EAX;
  
  Base::Base(&this->super_Base,head,MAT,0x21);
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)(head + 0x10);
  readSequence<njoy::ENDFtk::section::ReactionBlock,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->reactions_,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0x21,*(int *)(head + 0x38),*(int *)head,in_EAX);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0x21);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try:
    Base( head, MAT, 33 ), mtl_( head.L2() ),
    reactions_(
      readSequence< ReactionBlock >( begin, end, lineNumber,
                                  MAT, 33, head.MT(), head.N2() ) ) {
    readSEND(begin, end, lineNumber, MAT, 33 );
  } catch( std::exception& e ) {

    Log::info( "Trouble while reading section {} of File 33 of Material {}",
               head.MT(), MAT );
    throw e;
  }